

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

S2Point * __thiscall
S2Builder::SnapSite(S2Point *__return_storage_ptr__,S2Builder *this,S2Point *point)

{
  VType VVar1;
  VType VVar2;
  VType VVar3;
  _Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_> _Var4;
  S2Error *this_00;
  S1Angle SVar5;
  S1Angle SVar6;
  S1ChordAngle dist_moved;
  S1ChordAngle local_28;
  
  if (this->snapping_requested_ == false) {
    __return_storage_ptr__->c_[2] = point->c_[2];
    VVar1 = point->c_[1];
    __return_storage_ptr__->c_[0] = point->c_[0];
    __return_storage_ptr__->c_[1] = VVar1;
  }
  else {
    _Var4.super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl =
         (this->options_).snap_function_._M_t.
         super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
         ._M_t.
         super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
         .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>;
    (**(code **)(*(long *)_Var4.super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl
                + 0x28))
              (__return_storage_ptr__,
               _Var4.super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl,point);
    S1ChordAngle::S1ChordAngle(&local_28,__return_storage_ptr__,point);
    if ((this->site_snap_radius_ca_).length2_ <= local_28.length2_ &&
        local_28.length2_ != (this->site_snap_radius_ca_).length2_) {
      this_00 = this->error_;
      VVar1 = point->c_[0];
      VVar2 = point->c_[1];
      VVar3 = point->c_[2];
      SVar5 = S1ChordAngle::ToAngle(&local_28);
      SVar6 = S1ChordAngle::ToAngle(&this->site_snap_radius_ca_);
      S2Error::Init(this_00,BUILDER_SNAP_RADIUS_TOO_SMALL,
                    "Snap function moved vertex (%.15g, %.15g, %.15g) by %.15g, which is more than the specified snap radius of %.15g"
                    ,SUB84(VVar1,0),VVar2,VVar3,SVar5.radians_,SUB84(SVar6.radians_,0));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Builder::SnapSite(const S2Point& point) const {
  if (!snapping_requested_) return point;
  S2Point site = options_.snap_function().SnapPoint(point);
S1ChordAngle dist_moved(site, point);
  if (dist_moved > site_snap_radius_ca_) {
    error_->Init(S2Error::BUILDER_SNAP_RADIUS_TOO_SMALL,
                 "Snap function moved vertex (%.15g, %.15g, %.15g) "
                 "by %.15g, which is more than the specified snap "
                 "radius of %.15g", point.x(), point.y(), point.z(),
                 dist_moved.ToAngle().radians(),
                 site_snap_radius_ca_.ToAngle().radians());
  }
  return site;
}